

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Track::Seek(Track *this,longlong time_ns,BlockEntry **pResult)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Cluster *this_00;
  longlong lVar3;
  Track *pTrack;
  long lVar4;
  BlockEntry *pBVar5;
  long *in_RDX;
  long in_RSI;
  Track *in_RDI;
  longlong t;
  Cluster **mid;
  Cluster **hi;
  Cluster **lo;
  Cluster **j;
  Cluster **i;
  long count;
  Cluster **clusters;
  Cluster *pCluster;
  long status;
  Cluster *in_stack_ffffffffffffff90;
  Block *in_stack_ffffffffffffff98;
  Segment **ppSVar6;
  BlockEntry **in_stack_ffffffffffffffa0;
  Segment **ppSVar7;
  Track *in_stack_ffffffffffffffa8;
  Segment **ppSVar8;
  Segment **time_ns_00;
  Cluster *pCVar9;
  Cluster *this_01;
  long local_8;
  
  local_8 = GetFirst(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (-1 < local_8) {
    bVar2 = BlockEntry::EOS((BlockEntry *)0x18285f);
    if (bVar2) {
      local_8 = 0;
    }
    else {
      this_00 = BlockEntry::GetCluster((BlockEntry *)*in_RDX);
      (**(code **)(*(long *)*in_RDX + 0x10))();
      lVar3 = Block::GetTime(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      if (lVar3 < in_RSI) {
        pCVar9 = (Cluster *)in_RDI->m_pSegment->m_clusters;
        pTrack = (Track *)Segment::GetCount(in_RDI->m_pSegment);
        this_01 = pCVar9;
        lVar4 = Cluster::GetIndex(this_00);
        ppSVar8 = &pCVar9->m_pSegment + lVar4;
        ppSVar6 = &this_01->m_pSegment + (long)pTrack;
        time_ns_00 = ppSVar8;
        while (ppSVar7 = ppSVar6, ppSVar8 < ppSVar7) {
          auVar1._8_8_ = (long)ppSVar7 - (long)ppSVar8 >> 0x3f;
          auVar1._0_8_ = (long)ppSVar7 - (long)ppSVar8 >> 3;
          ppSVar6 = ppSVar8 + SUB168(auVar1 / SEXT816(2),0);
          lVar3 = Cluster::GetTime((Cluster *)in_RDI);
          if (lVar3 <= in_RSI) {
            ppSVar8 = ppSVar6 + 1;
            ppSVar6 = ppSVar7;
          }
        }
        do {
          if (ppSVar8 <= time_ns_00) {
            pBVar5 = GetEOS(in_RDI);
            *in_RDX = (long)pBVar5;
            return 0;
          }
          ppSVar8 = ppSVar8 + 0xffffffffffffffff;
          pBVar5 = Cluster::GetEntry(this_01,pTrack,(longlong)time_ns_00);
          *in_RDX = (long)pBVar5;
        } while ((*in_RDX == 0) || (bVar2 = BlockEntry::EOS((BlockEntry *)0x182a37), bVar2));
        local_8 = 0;
      }
      else {
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

long Track::Seek(long long time_ns, const BlockEntry*& pResult) const {
  const long status = GetFirst(pResult);

  if (status < 0)  // buffer underflow, etc
    return status;

  assert(pResult);

  if (pResult->EOS())
    return 0;

  const Cluster* pCluster = pResult->GetCluster();
  assert(pCluster);
  assert(pCluster->GetIndex() >= 0);

  if (time_ns <= pResult->GetBlock()->GetTime(pCluster))
    return 0;

  Cluster** const clusters = m_pSegment->m_clusters;
  assert(clusters);

  const long count = m_pSegment->GetCount();  // loaded only, not preloaded
  assert(count > 0);

  Cluster** const i = clusters + pCluster->GetIndex();
  assert(i);
  assert(*i == pCluster);
  assert(pCluster->GetTime() <= time_ns);

  Cluster** const j = clusters + count;

  Cluster** lo = i;
  Cluster** hi = j;

  while (lo < hi) {
    // INVARIANT:
    //[i, lo) <= time_ns
    //[lo, hi) ?
    //[hi, j)  > time_ns

    Cluster** const mid = lo + (hi - lo) / 2;
    assert(mid < hi);

    pCluster = *mid;
    assert(pCluster);
    assert(pCluster->GetIndex() >= 0);
    assert(pCluster->GetIndex() == long(mid - m_pSegment->m_clusters));

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      lo = mid + 1;
    else
      hi = mid;

    assert(lo <= hi);
  }

  assert(lo == hi);
  assert(lo > i);
  assert(lo <= j);

  while (lo > i) {
    pCluster = *--lo;
    assert(pCluster);
    assert(pCluster->GetTime() <= time_ns);

    pResult = pCluster->GetEntry(this);

    if ((pResult != 0) && !pResult->EOS())
      return 0;

    // landed on empty cluster (no entries)
  }

  pResult = GetEOS();  // weird
  return 0;
}